

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall
rsg::SwizzleOp::SwizzleOp(SwizzleOp *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  int iVar1;
  VariableType *pVVar2;
  Random *pRVar3;
  iterator first;
  iterator last;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar4;
  int local_98;
  int local_94;
  int inElemNdx;
  int elemNdx;
  undefined1 local_88;
  value_type_conflict1 local_7c;
  undefined1 local_78 [4];
  int ndx;
  set<int,_std::less<int>,_std::allocator<int>_> availableElements;
  int numOutputElements;
  GeneratorState *state_local;
  SwizzleOp *this_local;
  
  Expression::Expression(&this->super_Expression);
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__SwizzleOp_032da240;
  ValueRange::ValueRange(&this->m_outValueRange,valueRange);
  this->m_numInputElements = 0;
  this->m_child = (Expression *)0x0;
  ValueStorage<64>::ValueStorage(&this->m_value);
  pVVar2 = ValueRange::getType(&this->m_outValueRange);
  ValueStorage<64>::setStorage(&this->m_value,pVVar2);
  pVVar2 = ValueRange::getType(&this->m_outValueRange);
  availableElements._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       VariableType::getNumElements(pVVar2);
  pRVar3 = GeneratorState::getRandom(state);
  iVar1 = ::deMax32((int)availableElements._M_t._M_impl.super__Rb_tree_header._M_node_count,2);
  iVar1 = de::Random::getInt(pRVar3,iVar1,4);
  this->m_numInputElements = iVar1;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_78);
  for (local_7c = 0; local_7c < this->m_numInputElements; local_7c = local_7c + 1) {
    pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_78,&local_7c);
    _inElemNdx = pVar4.first._M_node;
    local_88 = pVar4.second;
  }
  for (local_94 = 0; local_94 < 4; local_94 = local_94 + 1) {
    if (local_94 < (int)availableElements._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      pRVar3 = GeneratorState::getRandom(state);
      first = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_78);
      last = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)local_78);
      local_98 = de::Random::choose<int,std::_Rb_tree_const_iterator<int>>
                           (pRVar3,(_Rb_tree_const_iterator<int>)first._M_node,
                            (_Rb_tree_const_iterator<int>)last._M_node);
      std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_78,&local_98);
      this->m_swizzle[local_94] = (deUint8)local_98;
    }
    else {
      this->m_swizzle[local_94] = '\0';
    }
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_78);
  return;
}

Assistant:

SwizzleOp::SwizzleOp (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_outValueRange		(valueRange)
	, m_numInputElements	(0)
	, m_child				(DE_NULL)
{
	DE_ASSERT(!m_outValueRange.getType().isVoid()); // \todo [2011-06-13 pyry] Void support
	DE_ASSERT(m_outValueRange.getType().isFloatOrVec()	||
			  m_outValueRange.getType().isIntOrVec()	||
			  m_outValueRange.getType().isBoolOrVec());

	m_value.setStorage(m_outValueRange.getType());

	int numOutputElements	= m_outValueRange.getType().getNumElements();

	// \note Swizzle works for vector types only.
	// \todo [2011-06-13 pyry] Use components multiple times.
	m_numInputElements		= state.getRandom().getInt(deMax32(numOutputElements, 2), 4);

	std::set<int> availableElements;
	for (int ndx = 0; ndx < m_numInputElements; ndx++)
		availableElements.insert(ndx);

	// Randomize swizzle.
	for (int elemNdx = 0; elemNdx < (int)DE_LENGTH_OF_ARRAY(m_swizzle); elemNdx++)
	{
		if (elemNdx < numOutputElements)
		{
			int inElemNdx = state.getRandom().choose<int>(availableElements.begin(), availableElements.end());
			availableElements.erase(inElemNdx);
			m_swizzle[elemNdx] = (deUint8)inElemNdx;
		}
		else
			m_swizzle[elemNdx] = 0;
	}
}